

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  cmLocalGenerator *localGenerator;
  cmGeneratorTarget *this;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar5;
  __uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
  this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  ostream *poVar7;
  pointer ppcVar8;
  int iVar9;
  bool bVar10;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string report;
  string reportEntry;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  undefined8 local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  undefined8 local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  undefined8 local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  char *local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string local_248;
  string local_228;
  string local_208;
  string interfaceProperty;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [22];
  string local_50 [32];
  
  local_2b0 = defaultValue;
  getTypedProperty<std::__cxx11::string>
            (__return_storage_ptr__,tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&headPropKeys,tgt);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (headPropKeys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     headPropKeys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar10 = _Var4._M_current !=
           headPropKeys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  if (_Var4._M_current !=
      headPropKeys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish && bVar2) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11f0,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  pvVar5 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar5->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar5->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&report," * Target \"",(allocator<char> *)&e);
    std::__cxx11::string::append((string *)&report);
    if (_Var4._M_current !=
        headPropKeys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&report);
      std::__cxx11::string::string((string *)&local_2d0,(string *)__return_storage_ptr__);
      _e = (pointer)local_1b8;
      if (local_2d0 == &local_2c0) {
        local_1b8[0]._8_8_ = local_2c0._8_8_;
      }
      else {
        _e = (pointer)local_2d0;
      }
      local_1b8[0]._M_allocated_capacity._1_7_ = local_2c0._M_allocated_capacity._1_7_;
      local_1b8[0]._M_local_buf[0] = local_2c0._M_local_buf[0];
      local_2c8 = 0;
      local_2c0._M_local_buf[0] = '\0';
      local_2d0 = &local_2c0;
      std::__cxx11::string::append((string *)&report);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    std::__cxx11::string::append((char *)&report);
    std::operator+(&interfaceProperty,"INTERFACE_",p);
    bVar3 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    if (bVar3) {
      this_00.
      super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl =
           (__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
            )operator_new(0x68);
      localGenerator = tgt->LocalGenerator;
      std::__cxx11::string::string((string *)&local_208,(string *)config);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                ((cmGeneratorExpressionInterpreter *)
                 this_00.
                 super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl,
                 localGenerator,&local_208,tgt,&local_228);
      genexInterpreter._M_t.
      super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
            )(__uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
              )this_00.
               super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
               .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl;
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
    }
    else {
      genexInterpreter._M_t.
      super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
            )(__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
              )0x0;
    }
    local_2a8 = (pvVar5->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    ppcVar8 = (pvVar5->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    while (ppcVar8 != local_2a8) {
      this = *ppcVar8;
      local_2a0 = ppcVar8;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&propKeys,this);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (propKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         propKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&interfaceProperty);
      pbVar1 = propKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      getTypedProperty<std::__cxx11::string>
                (&ifacePropContent,this,&interfaceProperty,
                 (cmGeneratorExpressionInterpreter *)
                 genexInterpreter._M_t.
                 super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl);
      reportEntry._M_string_length = 0;
      reportEntry._M_dataplus._M_p = (pointer)&reportEntry.field_2;
      reportEntry.field_2._M_local_buf[0] = '\0';
      if (_Var6._M_current == pbVar1) {
        if (_Var4._M_current ==
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish && bVar2) {
LAB_00267809:
          std::__cxx11::string::string(local_50,(string *)__return_storage_ptr__);
          _e = (pointer)local_1b8;
          local_1b8[0]._M_allocated_capacity =
               local_1b8[0]._M_allocated_capacity & 0xffffffffffffff00;
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::~string(local_50);
          if (_Var6._M_current != pbVar1) {
            consistentProperty(&consistent,__return_storage_ptr__,&ifacePropContent,t);
            std::__cxx11::string::append((string *)&report);
            bVar3 = std::operator!=(__return_storage_ptr__,&consistent.second);
            compatibilityAgree_abi_cxx11_((string *)&e,t,bVar3);
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            if (consistent.first == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar7 = std::operator<<((ostream *)&e,"Property ");
              poVar7 = std::operator<<(poVar7,(string *)p);
              poVar7 = std::operator<<(poVar7," on target \"");
              poVar7 = std::operator<<(poVar7,(string *)&tgt->Target->Name);
              poVar7 = std::operator<<(poVar7,"\" is\nimplied to be ");
              poVar7 = std::operator<<(poVar7,local_2b0);
              poVar7 = std::operator<<(poVar7,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar7 = std::operator<<(poVar7,(string *)p);
              poVar7 = std::operator<<(poVar7," property on\ndependency \"");
              poVar7 = std::operator<<(poVar7,(string *)&this->Target->Name);
              std::operator<<(poVar7,"\" is in conflict.\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_248);
              goto LAB_00267b36;
            }
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            iVar9 = 3;
            goto LAB_00267b4e;
          }
          iVar9 = 3;
        }
        else {
          iVar9 = 3;
        }
      }
      else {
        std::__cxx11::string::append((char *)&reportEntry);
        std::__cxx11::string::append((string *)&reportEntry);
        std::__cxx11::string::append((char *)&reportEntry);
        std::__cxx11::string::string((string *)&local_310,(string *)&ifacePropContent);
        _e = (pointer)local_1b8;
        if (local_310 == &local_300) {
          local_1b8[0]._8_8_ = local_300._8_8_;
        }
        else {
          _e = (pointer)local_310;
        }
        local_1b8[0]._M_allocated_capacity._1_7_ = local_300._M_allocated_capacity._1_7_;
        local_1b8[0]._M_local_buf[0] = local_300._M_local_buf[0];
        local_308 = 0;
        local_300._M_local_buf[0] = '\0';
        local_310 = &local_300;
        std::__cxx11::string::append((string *)&reportEntry);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::append((char *)&reportEntry);
        if (_Var4._M_current ==
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (bVar2) goto LAB_00267809;
          if (bVar10) {
            consistentProperty(&consistent,__return_storage_ptr__,&ifacePropContent,t);
            std::__cxx11::string::append((string *)&report);
            bVar10 = std::operator!=(__return_storage_ptr__,&consistent.second);
            compatibilityAgree_abi_cxx11_((string *)&e,t,bVar10);
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            if (consistent.first == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar7 = std::operator<<((ostream *)&e,"The INTERFACE_");
              poVar7 = std::operator<<(poVar7,(string *)p);
              poVar7 = std::operator<<(poVar7," property of \"");
              poVar7 = std::operator<<(poVar7,(string *)&this->Target->Name);
              poVar7 = std::operator<<(poVar7,"\" does\nnot agree with the value of ");
              poVar7 = std::operator<<(poVar7,(string *)p);
              poVar7 = std::operator<<(poVar7," already determined\nfor \"");
              poVar7 = std::operator<<(poVar7,(string *)&tgt->Target->Name);
              std::operator<<(poVar7,"\".\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_248);
              std::__cxx11::string::~string((string *)&local_248);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              iVar9 = 2;
            }
            else {
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              iVar9 = 3;
            }
            std::__cxx11::string::~string((string *)&consistent.second);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                           &reportEntry,"(Interface set)\n");
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            iVar9 = 0;
          }
          bVar10 = true;
        }
        else {
          consistentProperty(&consistent,__return_storage_ptr__,&ifacePropContent,t);
          std::__cxx11::string::append((string *)&report);
          bVar3 = std::operator!=(__return_storage_ptr__,&consistent.second);
          compatibilityAgree_abi_cxx11_((string *)&e,t,bVar3);
          std::__cxx11::string::append((string *)&report);
          std::__cxx11::string::~string((string *)&e);
          if (consistent.first == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar7 = std::operator<<((ostream *)&e,"Property ");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," on target \"");
            poVar7 = std::operator<<(poVar7,(string *)&tgt->Target->Name);
            poVar7 = std::operator<<(poVar7,"\" does\nnot match the INTERFACE_");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," property requirement\nof dependency \"");
            poVar7 = std::operator<<(poVar7,(string *)&this->Target->Name);
            std::operator<<(poVar7,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_248);
LAB_00267b36:
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            iVar9 = 2;
          }
          else {
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            iVar9 = 3;
          }
LAB_00267b4e:
          std::__cxx11::string::~string((string *)&consistent.second);
        }
      }
      std::__cxx11::string::~string((string *)&reportEntry);
      std::__cxx11::string::~string((string *)&ifacePropContent);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&propKeys);
      if ((iVar9 != 3) && (iVar9 != 0)) break;
      ppcVar8 = local_2a0 + 1;
    }
    std::__cxx11::string::string((string *)&local_2f0,(string *)__return_storage_ptr__);
    _e = (pointer)local_1b8;
    if (local_2f0 == &local_2e0) {
      local_1b8[0]._8_8_ = local_2e0._8_8_;
    }
    else {
      _e = (pointer)local_2f0;
    }
    local_2e8 = 0;
    local_2e0._M_local_buf[0] = '\0';
    local_2f0 = &local_2e0;
    compatibilityType_abi_cxx11_((string *)&consistent,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,(string *)&e,&report,(string *)&consistent);
    std::__cxx11::string::~string((string *)&consistent);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr(&genexInterpreter);
    std::__cxx11::string::~string((string *)&interfaceProperty);
    std::__cxx11::string::~string((string *)&report);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&headPropKeys);
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}